

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kmip.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Kmip::revokeCredential
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Kmip *this,Path *scope,Path *role,Parameters *parameters)

{
  Client *client;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  Url local_50;
  Parameters *local_30;
  Parameters *parameters_local;
  Path *role_local;
  Path *scope_local;
  Kmip *this_local;
  
  client = *(Client **)this;
  local_30 = parameters;
  parameters_local = (Parameters *)role;
  role_local = scope;
  scope_local = (Path *)this;
  this_local = (Kmip *)__return_storage_ptr__;
  Vault::operator+(&local_f0,"scope/",scope);
  std::operator+(&local_d0,&local_f0,"/role/");
  Vault::operator+(&local_b0,&local_d0,
                   (Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)parameters_local);
  std::operator+(&local_90,&local_b0,"credential/revoke");
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_70,&local_90);
  getUrl(&local_50,this,&local_70);
  HttpConsumer::post(__return_storage_ptr__,client,&local_50,local_30);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_50);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Kmip::revokeCredential(const Path &scope, const Path &role,
                              const Parameters &parameters) {
  return HttpConsumer::post(
      client_,
      getUrl(Path{"scope/" + scope + "/role/" + role + "credential/revoke"}),
      parameters);
}